

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintBundle.h
# Opt level: O2

void __thiscall PrintBundle::LoadLayerSettings(PrintBundle *this)

{
  pointer pbVar1;
  char cVar2;
  int iVar3;
  istream *piVar4;
  long lVar5;
  ostream *poVar6;
  size_type sVar7;
  Layer L;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rowData;
  string OneAttribute;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  string file;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ifstream LayerInfoFile;
  
  std::ifstream::ifstream(&LayerInfoFile);
  std::operator+(&file,&this->Folder,"/layersettings.csv");
  std::ifstream::open((char *)&LayerInfoFile,(_Ios_Openmode)file._M_dataplus._M_p);
  this->numLayers = 0;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    poVar6 = std::operator<<((ostream *)&std::cout,"Unable to read in Settings file. Check again");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  else {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&LayerInfoFile,(string *)&line);
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&LayerInfoFile,(string *)&line);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      rowData.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      L.imageLoc._M_dataplus._M_p = (pointer)&L.imageLoc.field_2;
      L.imageLoc._M_string_length = 0;
      L.imageLoc.field_2._M_local_buf[0] = '\0';
      L.index = 0;
      L.FirstApproachWait = 0;
      rowData.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      rowData.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      L.ModelApproachWait = 0;
      while (line._M_string_length != 0) {
        cVar2 = (char)&line;
        lVar5 = std::__cxx11::string::find(cVar2,0x2c);
        if (lVar5 == -1) break;
        OneAttribute._M_dataplus._M_p = (pointer)&OneAttribute.field_2;
        OneAttribute._M_string_length = 0;
        OneAttribute.field_2._M_local_buf[0] = '\0';
        std::__cxx11::string::find(cVar2,0x2c);
        std::__cxx11::string::substr((ulong)&local_258,(ulong)&line);
        std::__cxx11::string::operator=((string *)&OneAttribute,(string *)&local_258);
        std::__cxx11::string::~string((string *)&local_258);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&rowData,&OneAttribute);
        std::__cxx11::string::erase((ulong)&line,0);
        std::__cxx11::string::~string((string *)&OneAttribute);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&rowData,&line);
      pbVar1 = rowData.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar3 = atoi(((rowData.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
      L.index = iVar3;
      iVar3 = atoi(pbVar1[1]._M_dataplus._M_p);
      L.FirstApproachWait = iVar3;
      L.BurnInApproachWait = atoi(pbVar1[2]._M_dataplus._M_p);
      L.ModelApproachWait = atoi(pbVar1[3]._M_dataplus._M_p);
      std::operator+(&local_2b8,&this->Folder,"/slice_");
      std::__cxx11::to_string(&local_278,this->numLayers + 1);
      std::operator+(&local_258,&local_2b8,&local_278);
      std::operator+(&OneAttribute,&local_258,".png");
      std::__cxx11::string::operator=((string *)&L.imageLoc,(string *)&OneAttribute);
      std::__cxx11::string::~string((string *)&OneAttribute);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::deque<Layer,_std::allocator<Layer>_>::push_back(&(this->Layers).c,&L);
      this->numLayers = this->numLayers + 1;
      std::__cxx11::string::~string((string *)&L.imageLoc);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&rowData);
    }
  }
  sVar7 = std::deque<Layer,_std::allocator<Layer>_>::size(&(this->Layers).c);
  this->numLayers = (int)sVar7;
  std::ifstream::close();
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::string::~string((string *)&file);
  std::ifstream::~ifstream(&LayerInfoFile);
  return;
}

Assistant:

void PrintBundle::LoadLayerSettings()
{
	ifstream LayerInfoFile;
	string file = Folder + "/layersettings.csv";
	LayerInfoFile.open(file.c_str());
	
	numLayers = 0;
	string line;
	if (LayerInfoFile.is_open())
	{
		//Get rid of the first row
		getline(LayerInfoFile, line);

		//Parse remaining rows
		while(getline(LayerInfoFile, line))
		{
			vector <string> rowData;
			Layer L;

			while(line.length() != 0 && line.find(',') != string::npos)
			{
				size_t pos;
				string OneAttribute;
				pos = line.find_first_of(',');
				OneAttribute = line.substr(0, pos);
				rowData.push_back(OneAttribute);
				line.erase(0, pos+1);

			}
			rowData.push_back(line);

			L.index = atoi(rowData[0].c_str());
			L.FirstApproachWait = atoi(rowData[1].c_str());
			L.BurnInApproachWait = atoi(rowData[2].c_str());
			L.ModelApproachWait = atoi(rowData[3].c_str());
			L.imageLoc = Folder + "/slice_" + to_string(numLayers+1) + ".png";
			
			Layers.push(L);
			numLayers++;

		}
		
	}

	else
		cout << "Unable to read in Settings file. Check again" << endl;

	numLayers = Layers.size();

	LayerInfoFile.close();

}